

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::evaluateFeatureFile(QMakeEvaluator *this,QString *fileName,bool silent)

{
  QMakeFeatureRoots *pQVar1;
  QString *pQVar2;
  char cVar3;
  bool bVar4;
  VisitReturn VVar5;
  QString *this_00;
  QList<ProString> *this_01;
  storage_type *psVar6;
  int root;
  ulong uVar7;
  ProString *this_02;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayDataPointer<char16_t> local_f8;
  undefined1 local_e0 [24];
  QLatin1String local_c8;
  ProString afn;
  QArrayDataPointer<char16_t> local_88;
  QLatin1String local_70;
  QLatin1String local_60;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (fileName->d).d;
  local_50.ptr = (fileName->d).ptr;
  local_50.size = (fileName->d).size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QLatin1String::QLatin1String(&local_60,".prf");
  cVar3 = QString::endsWith((QLatin1String *)&local_50,(CaseSensitivity)local_60.m_size);
  if (cVar3 == '\0') {
    QLatin1String::QLatin1String(&local_70,".prf");
    QString::append((QLatin1String *)&local_50);
  }
  if ((this->m_featureRoots).d.ptr == (QMakeFeatureRoots *)0x0) {
    updateFeaturePaths(this);
  }
  local_88.size = -0x5555555555555556;
  local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  currentFileName((QString *)&local_88,this);
  afn.m_string.d._0_16_ = QMakeInternal::IoUtils::fileName((QString *)&local_88);
  local_e0._0_16_ = (undefined1  [16])QMakeInternal::IoUtils::fileName((QString *)&local_50);
  bVar4 = operator!=((QStringView *)&afn,(QStringView *)local_e0);
  if (bVar4) {
    QString::clear((QString *)&local_88);
  }
  pQVar1 = (this->m_featureRoots).d.ptr;
  std::pair<QString,_QString>::pair<QString_&,_QString_&,_true>
            ((pair<QString,_QString> *)&afn,(QString *)&local_50,(QString *)&local_88);
  this_00 = QHash<std::pair<QString,_QString>,_QString>::operator[]
                      (&pQVar1->cache,(pair<QString,_QString> *)&afn);
  std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&afn);
  if ((this_00->d).ptr == (char16_t *)0x0) {
    pQVar1 = (this->m_featureRoots).d.ptr;
    if (local_88.size == 0) {
      lVar10 = 0;
    }
    else {
      lVar9 = 0x100000000;
      afn.m_string.d._0_16_ = QMakeInternal::IoUtils::pathName((QString *)&local_88);
      lVar8 = 0x10;
      lVar10 = 0;
      for (uVar7 = 0; uVar7 < (ulong)(pQVar1->paths).d.size; uVar7 = uVar7 + 1) {
        pQVar2 = (pQVar1->paths).d.ptr;
        local_e0._8_8_ = *(QString **)((long)pQVar2 + lVar8 + -8);
        local_e0._0_8_ = *(QString **)((long)&(pQVar2->d).d + lVar8);
        bVar4 = comparesEqual((QStringView *)&afn,(QStringView *)local_e0);
        if (bVar4) {
          lVar10 = lVar9 >> 0x20;
          break;
        }
        lVar9 = lVar9 + 0x100000000;
        lVar8 = lVar8 + 0x18;
      }
    }
    lVar8 = lVar10 * 0x18;
    for (; lVar10 < (pQVar1->paths).d.size; lVar10 = lVar10 + 1) {
      afn.m_string.d.size = -0x5555555555555556;
      afn.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      afn.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_e0._8_8_ = &local_50;
      local_e0._0_8_ = (QString *)((long)&(((pQVar1->paths).d.ptr)->d).d + lVar8);
      QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                (&afn.m_string,(QStringBuilder<const_QString_&,_QString_&> *)local_e0);
      bVar4 = QMakeInternal::IoUtils::exists(&afn.m_string);
      if (bVar4) {
        QString::operator=((QString *)&local_50,(QString *)&afn);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&afn);
        goto LAB_001fa32f;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&afn);
      lVar8 = lVar8 + 0x18;
    }
    QLatin1String::QLatin1String(&local_c8,"");
    QString::operator=((QString *)&local_50,(QLatin1String *)local_c8.m_size);
LAB_001fa32f:
    QString::operator=(this_00,(QString *)&local_50);
  }
  else {
    QString::operator=((QString *)&local_50,(QString *)this_00);
  }
  if (local_50.size == 0) {
    VVar5 = ReturnFalse;
    if (silent) goto LAB_001fa4c7;
    psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray("Cannot find feature %1",0x17);
    this_02 = (ProString *)local_e0;
    QVar12.m_data = psVar6;
    QVar12.m_size = (qsizetype)this_02;
    QString::fromLatin1(QVar12);
    VVar5 = ReturnFalse;
    QString::arg<QString,_true>(&afn.m_string,(QString *)this_02,fileName,0,(QChar)0x20);
    evalError(this,&afn.m_string);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&afn);
  }
  else {
    ProKey::ProKey((ProKey *)&afn,"QMAKE_INTERNAL_INCLUDED_FEATURES");
    this_01 = &valuesRef(this,(ProKey *)&afn)->super_QList<ProString>;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&afn);
    afn.m_file = -0x55555556;
    afn._36_4_ = 0xaaaaaaaa;
    afn.m_hash = 0xaaaaaaaaaaaaaaaa;
    afn.m_string.d.size = -0x5555555555555556;
    afn.m_offset = -0x55555556;
    afn.m_length = -0x55555556;
    afn.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    afn.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    ProString::ProString(&afn,(QString *)&local_50);
    VVar5 = ReturnTrue;
    bVar4 = ProStringList::contains((ProStringList *)this_01,&afn,CaseSensitive);
    if (bVar4) {
      if (!silent) {
        psVar6 = (storage_type *)
                 QByteArrayView::lengthHelperCharArray("Feature %1 already included",0x1c);
        QVar11.m_data = psVar6;
        QVar11.m_size = (qsizetype)&local_f8;
        QString::fromLatin1(QVar11);
        QString::arg<QString,_true>((QString *)local_e0,(QString *)&local_f8,fileName,0,(QChar)0x20)
        ;
        languageWarning(this,(QString *)local_e0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      }
    }
    else {
      QList<ProString>::emplaceBack<ProString_const&>(this_01,&afn);
      VVar5 = evaluateFile(this,(QString *)&local_50,EvalFeatureFile,(LoadFlags)0x0);
    }
    this_02 = &afn;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_02);
LAB_001fa4c7:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar5;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFeatureFile(
        const QString &fileName, bool silent)
{
    QString fn = fileName;
    if (!fn.endsWith(QLatin1String(".prf")))
        fn += QLatin1String(".prf");

    if (!m_featureRoots)
        updateFeaturePaths();
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.lock();
#endif
    QString currFn = currentFileName();
    if (IoUtils::fileName(currFn) != IoUtils::fileName(fn))
        currFn.clear();
    // Null values cannot regularly exist in the hash, so they indicate that the value still
    // needs to be determined. Failed lookups are represented via non-null empty strings.
    QString *fnp = &m_featureRoots->cache[qMakePair(fn, currFn)];
    if (fnp->isNull()) {
#ifdef QMAKE_OVERRIDE_PRFS
        {
            QString ovrfn(QLatin1String(":/qmake/override_features/") + fn);
            if (QFileInfo::exists(ovrfn)) {
                fn = ovrfn;
                goto cool;
            }
        }
#endif
        {
            int start_root = 0;
            const QStringList &paths = m_featureRoots->paths;
            if (!currFn.isEmpty()) {
                QStringView currPath = IoUtils::pathName(currFn);
                for (int root = 0; root < paths.size(); ++root)
                    if (currPath == paths.at(root)) {
                        start_root = root + 1;
                        break;
                    }
            }
            for (int root = start_root; root < paths.size(); ++root) {
                QString fname = paths.at(root) + fn;
                if (IoUtils::exists(fname)) {
                    fn = fname;
                    goto cool;
                }
            }
        }
#ifdef QMAKE_BUILTIN_PRFS
        fn.prepend(QLatin1String(":/qmake/features/"));
        if (QFileInfo::exists(fn))
            goto cool;
#endif
        fn = QLatin1String(""); // Indicate failed lookup. See comment above.

      cool:
        *fnp = fn;
    } else {
        fn = *fnp;
    }
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.unlock();
#endif
    if (fn.isEmpty()) {
        if (!silent)
            evalError(fL1S("Cannot find feature %1").arg(fileName));
        return ReturnFalse;
    }
    ProStringList &already = valuesRef(ProKey("QMAKE_INTERNAL_INCLUDED_FEATURES"));
    ProString afn(fn);
    if (already.contains(afn)) {
        if (!silent)
            languageWarning(fL1S("Feature %1 already included").arg(fileName));
        return ReturnTrue;
    }
    already.append(afn);

#ifdef PROEVALUATOR_CUMULATIVE
    bool cumulative = m_cumulative;
    // Even when evaluating the project in cumulative mode to maximize the
    // chance of collecting all source declarations, prfs are evaluated in
    // exact mode to maximize the chance of them successfully executing
    // their programmatic function.
    m_cumulative = false;
#endif

    // The path is fully normalized already.
    VisitReturn ok = evaluateFile(fn, QMakeHandler::EvalFeatureFile, LoadProOnly);

#ifdef PROEVALUATOR_CUMULATIVE
    m_cumulative = cumulative;
    if (cumulative) {
        // As the data collected in cumulative mode is potentially total
        // garbage, yet the prfs fed with it are executed in exact mode,
        // we must ignore their results to avoid that evaluation is unduly
        // aborted.
        ok = ReturnTrue;
    }
#endif
    return ok;
}